

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddCapsule
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          double radius,double hlen,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar3;
  float fVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  dVar5 = radius;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar7._8_8_ = 0;
  auVar7._0_8_ = radius;
  auVar6._0_8_ = (double)SUB84(dVar5,0);
  auVar6._8_8_ = in_XMM0_Qb;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = hlen;
  auVar1 = vminsd_avx(auVar7,auVar1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar1._0_8_ * 0.2;
  auVar1 = vminsd_avx(auVar6,auVar8);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(auVar1._0_8_,this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  fVar3 = *(float *)&(material->
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
  uStack_34 = *(undefined4 *)
               ((long)&(material->
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + 4);
  uStack_30 = *(undefined4 *)
               &(material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
  uStack_2c = *(undefined4 *)
               ((long)&(material->
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi + 4);
  p_Var2 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_38 = fVar3;
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,CAPSULE,(shared_ptr<chrono::ChMaterialSurface> *)&local_38);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_2c,uStack_30) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_2c,uStack_30));
  }
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  fVar4 = (float)((double)fVar3 + radius);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  this_01 = (cbtCollisionShape *)cbtAlignedAllocInternal(0x48,0x10);
  cbtCapsuleShape::cbtCapsuleShape
            ((cbtCapsuleShape *)this_01,(float)((double)fVar3 + radius),
             (float)((double)fVar4 + hlen) + (float)((double)fVar4 + hlen));
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddCapsule(std::shared_ptr<ChMaterialSurface> material,
                                        double radius,
                                        double hlen,
                                        const ChVector<>& pos,
                                        const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(radius, hlen)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::CAPSULE, material);

    cbtScalar ar = (cbtScalar)(radius + GetEnvelope());
    cbtScalar ah = (cbtScalar)(hlen + GetEnvelope());
    shape->m_bt_shape = new cbtCapsuleShape(ar, 2 * ah);
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}